

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool upb_Arena_IsFused(upb_Arena *a,upb_Arena *b)

{
  upb_ArenaInternal *ai;
  upb_ArenaInternal *ai_00;
  _Bool _Var1;
  bool bVar2;
  upb_ArenaRoot uVar3;
  
  if (a == b) {
    _Var1 = true;
  }
  else {
    uVar3 = _upb_Arena_FindRoot((upb_ArenaInternal *)(a + 1));
    ai = (upb_ArenaInternal *)(b + 1);
    ai_00 = uVar3.root;
    do {
      uVar3 = _upb_Arena_FindRoot(ai);
      ai = uVar3.root;
      _Var1 = ai_00 == ai;
      if (_Var1) {
        return _Var1;
      }
      uVar3 = _upb_Arena_FindRoot(ai_00);
      bVar2 = ai_00 != uVar3.root;
      ai_00 = uVar3.root;
    } while (bVar2);
  }
  return _Var1;
}

Assistant:

bool upb_Arena_IsFused(const upb_Arena* a, const upb_Arena* b) {
  if (a == b) return true;  // trivial fuse
  upb_ArenaInternal* ra = _upb_Arena_FindRoot(upb_Arena_Internal(a)).root;
  upb_ArenaInternal* rb = upb_Arena_Internal(b);
  while (true) {
    rb = _upb_Arena_FindRoot(rb).root;
    if (ra == rb) return true;
    upb_ArenaInternal* tmp = _upb_Arena_FindRoot(ra).root;
    if (ra == tmp) return false;
    // a's root changed since we last checked.  Retry.
    ra = tmp;
  }
}